

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void helpScreen(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "==============================================================================="
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: GDScpp [ OPTION ] [ filenames ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-g(DS)          Does stuffs.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                  [.gds/.gds2/ file] -o [.gds2 file]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-i(nterpret)    Translates a GDS file directly to ASCII.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"                  [.gds/.gds2/ file]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-r(ead)  \t\t   Reads in specified file.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"                  [.gds/.gds2/ file]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "-rw(read/write) Reads in a GDS file and writes out what is stored.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "                  [.gds/.gds2/ file] -o [.gds2 file]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-v(ersion)    Displays the version number.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"-h(elp)       Help screen.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "==============================================================================="
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void helpScreen()
{
  cout << "===================================================================="
          "==========="
       << endl;
  cout << "Usage: GDScpp [ OPTION ] [ filenames ]" << endl;
  cout << "-g(DS)          Does stuffs." << endl;
  cout << "                  [.gds/.gds2/ file] -o [.gds2 file]" << endl;
  cout << "-i(nterpret)    Translates a GDS file directly to ASCII." << endl;
  cout << "                  [.gds/.gds2/ file]" << endl;
  cout << "-r(ead)  		   Reads in specified file." << endl;
  cout << "                  [.gds/.gds2/ file]" << endl;
  cout << "-rw(read/write) Reads in a GDS file and writes out what is stored."
       << endl;
  cout << "                  [.gds/.gds2/ file] -o [.gds2 file]" << endl;
  cout << "-v(ersion)    Displays the version number." << endl;
  cout << "-h(elp)       Help screen." << endl;
  cout << "===================================================================="
          "==========="
       << endl;
}